

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusPOMDPPlanner.cpp
# Opt level: O2

ValueFunctionPOMDPDiscrete * __thiscall
PerseusPOMDPPlanner::BackupStage
          (ValueFunctionPOMDPDiscrete *__return_storage_ptr__,PerseusPOMDPPlanner *this,BeliefSet *S
          ,ValueFunctionPOMDPDiscrete *V)

{
  undefined1 *this_00;
  _func_int *p_Var1;
  JointBeliefInterface *pJVar2;
  size_t sVar3;
  ostream *poVar4;
  PlanningUnitMADPDiscrete *this_01;
  ulong uVar5;
  ulong uVar6;
  int b;
  size_type __n;
  int iVar7;
  double dVar8;
  reference rVar9;
  int local_234;
  vector<double,_std::allocator<double>_> VBalpha;
  vector<double,_std::allocator<double>_> VB;
  AlphaVector alpha;
  AlphaVector local_1a8;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  _Bvector_base<std::allocator<bool>_> local_158;
  GaoVectorSet Gao;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  local_b0;
  
  BeliefValue::GetValues(&VB,S,V);
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var1 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
  this_01 = *(PlanningUnitMADPDiscrete **)
             (&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var1);
  if (this_01 == (PlanningUnitMADPDiscrete *)0x0) {
    this_01 = *(PlanningUnitMADPDiscrete **)
               (&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var1);
  }
  uVar6 = (long)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  sVar3 = PlanningUnitMADPDiscrete::GetNrStates(this_01);
  uVar6 = uVar6 >> 3;
  Gao.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&stillNeedToBeImproved,(long)(int)uVar6,(bool *)&Gao,(allocator_type *)&alpha);
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  AlphaVector::AlphaVector(&alpha,(long)(int)sVar3);
  this_00 = &(this->super_AlphaVectorPOMDP).field_0x8;
  Perseus::BackupStageLeadIn(&Gao,(Perseus *)this_00,V);
  uVar5 = uVar6 & 0xffffffff;
  local_234 = -1;
  while (iVar7 = (int)uVar6, iVar7 != 0) {
    if ((this->super_AlphaVectorPOMDP).field_0x92 == '\x01') {
      local_234 = local_234 + 1;
    }
    else {
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_158,&stillNeedToBeImproved);
      local_234 = Perseus::SampleNotImprovedBeliefIndex
                            ((Perseus *)this_00,(vector<bool,_std::allocator<bool>_> *)&local_158,
                             iVar7);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_158);
    }
    AlphaVectorPOMDP::BeliefBackup
              (&local_1a8,&this->super_AlphaVectorPOMDP,
               (S->
               super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
               _M_impl.super__Vector_impl_data._M_start[local_234],&Gao);
    AlphaVector::operator=(&alpha,&local_1a8);
    AlphaVector::~AlphaVector(&local_1a8);
    if ((this->super_AlphaVectorPOMDP).field_0x92 == '\0') {
      pJVar2 = (S->
               super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
               _M_impl.super__Vector_impl_data._M_start[local_234];
      dVar8 = (double)(**(code **)(*(long *)((long)&pJVar2->field_0x0 +
                                            *(long *)((long)*pJVar2 + -0xb8)) + 0x80))
                                ((long)&pJVar2->field_0x0 + *(long *)((long)*pJVar2 + -0xb8),
                                 &alpha._m_values);
      if (dVar8 < VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[local_234]) {
        BeliefValue::GetMaximizingVector(&local_1a8,S,local_234,V);
        AlphaVector::operator=(&alpha,&local_1a8);
        AlphaVector::~AlphaVector(&local_1a8);
      }
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(__return_storage_ptr__,&alpha)
    ;
    if ((this->super_AlphaVectorPOMDP).field_0x92 == '\x01') {
      uVar6 = (ulong)(iVar7 - 1);
    }
    else {
      BeliefValue::GetValues((vector<double,_std::allocator<double>_> *)&local_1a8,S,&alpha);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(&VBalpha,&local_1a8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_1a8);
      iVar7 = 0;
      for (__n = 0; uVar5 != __n; __n = __n + 1) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&stillNeedToBeImproved,__n);
        if ((*rVar9._M_p & rVar9._M_mask) != 0) {
          if (VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start[__n] <=
              VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[__n]) {
            rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&stillNeedToBeImproved,__n)
            ;
            uVar6 = (ulong)((int)uVar6 - 1);
            iVar7 = iVar7 + 1;
            *rVar9._M_p = *rVar9._M_p & ~rVar9._M_mask;
          }
        }
      }
      if (-1 < *(int *)&(this->super_AlphaVectorPOMDP).field_0x18) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Added vector for ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_234);
        std::operator<<(poVar4," (V ");
        poVar4 = std::ostream::_M_insert<double>
                           (VBalpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[local_234]);
        poVar4 = std::operator<<(poVar4," improved ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar7);
        poVar4 = std::operator<<(poVar4,")");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
  }
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(&local_b0,&Gao);
  Perseus::BackupStageLeadOut((Perseus *)this_00,&local_b0);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&local_b0);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&Gao);
  AlphaVector::~AlphaVector(&alpha);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&stillNeedToBeImproved.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&VBalpha.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&VB.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

ValueFunctionPOMDPDiscrete
PerseusPOMDPPlanner::BackupStage(const BeliefSet &S,
                                 const ValueFunctionPOMDPDiscrete &V)
{
    vector<double> VB=BeliefValue::GetValues(S,V),
        VBalpha;
    int nrB=VB.size(),
        nrNotImproved=nrB,
        nrS=GetPU()->GetNrStates(),
        k;
    vector<bool> stillNeedToBeImproved(nrB,true);
    ValueFunctionPOMDPDiscrete V1;
    AlphaVector alpha(nrS);

    GaoVectorSet Gao=BackupStageLeadIn(V);

    if(_m_computeVectorForEachBelief)
        k=-1;

    while(nrNotImproved!=0)
    {
        if(_m_computeVectorForEachBelief)
            k++;
        else // sample a belief index from the number of not improved beliefs
            k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,nrNotImproved);

        alpha=BeliefBackup(*S[k],Gao);

        if(!_m_computeVectorForEachBelief)
        {
            // check whether alpha improves the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());
            // if not, get copy from old value function
            if(x<VB[k])
            {
                alpha=BeliefValue::GetMaximizingVector(S,k,V);
                
#if DEBUG_PerseusPOMDPPlanner
                cout << "Getting n-1 vector for " << k << endl;
#endif
            }
        }

        // add alpha to V1
        V1.push_back(alpha);

        if(_m_computeVectorForEachBelief)
            nrNotImproved--;
        else
        {
            // update which beliefs have been improved
            VBalpha=BeliefValue::GetValues(S,alpha);
            int nrImprovedByAlpha=0;
            for(int b=0;b!=nrB;b++)
                if(stillNeedToBeImproved[b] && VBalpha[b]>=VB[b])
                {
                    stillNeedToBeImproved[b]=false;
                    nrNotImproved--;
                    nrImprovedByAlpha++;
                }

            if(GetVerbose() >= 0)
                cout << "Added vector for " << k << " (V " << VBalpha[k] 
                     << " improved " << nrImprovedByAlpha << ")" << endl;
#if DEBUG_PerseusPOMDPPlanner
            alpha.Print();
            if(nrImprovedByAlpha==0)
                abort();
#endif
        }
    }

    BackupStageLeadOut(Gao);

    return(V1);
}